

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_CommitTwoSeparateTransactions_Test::TestBody
          (Transaction_CommitTwoSeparateTransactions_Test *this)

{
  bool bVar1;
  shared_ptr<pstore::file::in_memory> *file;
  unsigned_long uVar2;
  unsigned_long uVar3;
  char *message;
  AssertHelper local_218;
  Message local_210;
  typed_address<pstore::trailer> local_208;
  typed_address<pstore::trailer> local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  header *header;
  size_t footer2;
  undefined1 local_1c8 [8];
  transaction<std::unique_lock<mock_mutex>_> t2;
  unique_lock<mock_mutex> local_180;
  undefined1 local_170 [8];
  transaction<std::unique_lock<mock_mutex>_> t1;
  undefined1 local_130 [7];
  mock_mutex mutex;
  database db;
  Transaction_CommitTwoSeparateTransactions_Test *this_local;
  
  file = in_memory_store::file(&(this->super_Transaction).store_);
  pstore::database::database<pstore::file::in_memory>((database *)local_130,file,true);
  pstore::database::set_vacuum_mode((database *)local_130,disabled);
  std::unique_lock<mock_mutex>::unique_lock(&local_180,(mutex_type *)&t1.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_170,(database *)local_130,&local_180);
  std::unique_lock<mock_mutex>::~unique_lock(&local_180);
  anon_unknown.dwarf_2883f3::append_int((transaction<std::unique_lock<mock_mutex>_> *)local_170,1);
  pstore::transaction_base::commit((transaction_base *)local_170);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_170);
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&footer2,(mutex_type *)&t1.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_1c8,(database *)local_130,
          (unique_lock<mock_mutex> *)&footer2);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&footer2);
  anon_unknown.dwarf_2883f3::append_int((transaction<std::unique_lock<mock_mutex>_> *)local_1c8,2);
  pstore::transaction_base::commit((transaction_base *)local_1c8);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_1c8);
  pstore::database::~database((database *)local_130);
  uVar2 = pstore::calc_alignment<unsigned_long>(0x40,8);
  uVar3 = pstore::calc_alignment<unsigned_long>(uVar2 + 0xb0,4);
  uVar2 = uVar2 + 0xb0 + uVar3 + 4;
  uVar3 = pstore::calc_alignment<unsigned_long>(uVar2,8);
  uVar2 = uVar2 + uVar3 + 0x70;
  uVar3 = pstore::calc_alignment<unsigned_long>(uVar2,4);
  uVar2 = uVar2 + uVar3 + 4;
  uVar3 = pstore::calc_alignment<unsigned_long>(uVar2,8);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )anon_unknown.dwarf_2883f3::Transaction::get_header(&this->super_Transaction);
  local_200 = pstore::typed_address<pstore::trailer>::make(uVar2 + uVar3);
  local_208 = std::atomic<pstore::typed_address<pstore::trailer>_>::load
                        ((atomic<pstore::typed_address<pstore::trailer>_> *)
                         ((long)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 0x28),memory_order_seq_cst);
  testing::internal::EqHelper::
  Compare<pstore::typed_address<pstore::trailer>,_pstore::typed_address<pstore::trailer>,_nullptr>
            ((EqHelper *)local_1f8,"pstore::typed_address<pstore::trailer>::make (footer2)",
             "header->footer_pos.load ()",&local_200,&local_208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x1a4,message);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  return;
}

Assistant:

TEST_F (Transaction, CommitTwoSeparateTransactions) {
    // Append two individual transactions, each containing a single int.
    {
        pstore::database db{store_.file ()};
        db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        mock_mutex mutex;
        {
            auto t1 = begin (db, mock_lock (mutex));
            append_int (t1, 1);
            t1.commit ();
        }
        {
            auto t2 = begin (db, mock_lock (mutex));
            append_int (t2, 2);
            t2.commit ();
        }
    }

    std::size_t footer2 = pstore::leader_size;
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));
    footer2 += sizeof (pstore::trailer);

    footer2 += pstore::calc_alignment (footer2, alignof (int));
    footer2 += sizeof (int);
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));
    footer2 += sizeof (pstore::trailer);

    footer2 += pstore::calc_alignment (footer2, alignof (int));
    footer2 += sizeof (int);
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));

    pstore::header const * const header = this->get_header ();
    EXPECT_EQ (pstore::typed_address<pstore::trailer>::make (footer2), header->footer_pos.load ());
}